

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O2

SampledSpectrum pbrt::Bilerp(array<float,_2> p,span<const_pbrt::SampledSpectrum> v)

{
  undefined1 auVar1 [16];
  SampledSpectrum *this;
  float fVar2;
  float fVar3;
  undefined1 in_register_00001208 [56];
  undefined1 auVar4 [64];
  undefined1 auVar11 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar18 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  SampledSpectrum SVar19;
  SampledSpectrum local_70;
  SampledSpectrum local_60;
  SampledSpectrum local_50;
  SampledSpectrum local_40;
  SampledSpectrum local_30;
  SampledSpectrum local_20;
  
  auVar4._8_56_ = in_register_00001208;
  auVar4._0_8_ = p.values;
  this = v.ptr;
  auVar18 = (undefined1  [56])0x0;
  fVar2 = p.values[0];
  auVar1 = vmovshdup_avx(auVar4._0_16_);
  fVar3 = auVar1._0_4_;
  auVar11 = (undefined1  [56])0x0;
  SVar19 = SampledSpectrum::operator*(this,(1.0 - fVar2) * (1.0 - fVar3));
  auVar12._0_8_ = SVar19.values.values._8_8_;
  auVar12._8_56_ = auVar18;
  auVar5._0_8_ = SVar19.values.values._0_8_;
  auVar5._8_56_ = auVar11;
  local_40.values.values = (array<float,_4>)vmovlhps_avx(auVar5._0_16_,auVar12._0_16_);
  auVar11 = (undefined1  [56])0x0;
  SVar19 = SampledSpectrum::operator*(this + 1,(1.0 - fVar3) * fVar2);
  auVar13._0_8_ = SVar19.values.values._8_8_;
  auVar13._8_56_ = auVar18;
  auVar6._0_8_ = SVar19.values.values._0_8_;
  auVar6._8_56_ = auVar11;
  local_50.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar13._0_16_);
  auVar11 = ZEXT856(local_50.values.values._8_8_);
  SVar19 = SampledSpectrum::operator+(&local_40,&local_50);
  auVar14._0_8_ = SVar19.values.values._8_8_;
  auVar14._8_56_ = auVar18;
  auVar7._0_8_ = SVar19.values.values._0_8_;
  auVar7._8_56_ = auVar11;
  local_30.values.values = (array<float,_4>)vmovlhps_avx(auVar7._0_16_,auVar14._0_16_);
  auVar11 = (undefined1  [56])0x0;
  SVar19 = SampledSpectrum::operator*(this + 2,(1.0 - fVar2) * fVar3);
  auVar15._0_8_ = SVar19.values.values._8_8_;
  auVar15._8_56_ = auVar18;
  auVar8._0_8_ = SVar19.values.values._0_8_;
  auVar8._8_56_ = auVar11;
  local_60.values.values = (array<float,_4>)vmovlhps_avx(auVar8._0_16_,auVar15._0_16_);
  auVar11 = ZEXT856(local_60.values.values._8_8_);
  SVar19 = SampledSpectrum::operator+(&local_30,&local_60);
  auVar16._0_8_ = SVar19.values.values._8_8_;
  auVar16._8_56_ = auVar18;
  auVar9._0_8_ = SVar19.values.values._0_8_;
  auVar9._8_56_ = auVar11;
  local_20.values.values = (array<float,_4>)vmovlhps_avx(auVar9._0_16_,auVar16._0_16_);
  auVar11 = (undefined1  [56])0x0;
  SVar19 = SampledSpectrum::operator*(this + 3,fVar3 * fVar2);
  auVar17._0_8_ = SVar19.values.values._8_8_;
  auVar17._8_56_ = auVar18;
  auVar10._0_8_ = SVar19.values.values._0_8_;
  auVar10._8_56_ = auVar11;
  local_70.values.values = (array<float,_4>)vmovlhps_avx(auVar10._0_16_,auVar17._0_16_);
  SVar19 = SampledSpectrum::operator+(&local_20,&local_70);
  return (array<float,_4>)(array<float,_4>)SVar19;
}

Assistant:

PBRT_CPU_GPU
inline SampledSpectrum Bilerp(pstd::array<Float, 2> p,
                              pstd::span<const SampledSpectrum> v) {
    return ((1 - p[0]) * (1 - p[1]) * v[0] + p[0] * (1 - p[1]) * v[1] +
            (1 - p[0]) * p[1] * v[2] + p[0] * p[1] * v[3]);
}